

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

void tbl_Init(void)

{
  Card_t *pCVar1;
  int iVar2;
  int i;
  long lVar3;
  int iVar4;
  bool bVar5;
  Card_t card;
  
  stk_InitFull(&PackStack);
  stk_InitEmpty(&RestStack);
  stk_InitEmptyArray(DeskStacks,7);
  stk_InitEmptyArray(ColorStacks,4);
  Score = 0;
  iVar4 = 1;
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    iVar2 = iVar4;
    while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
      stk_Pop(&PackStack,&card);
      stk_PushCopy(DeskStacks + lVar3,card);
    }
    pCVar1 = stk_TopCard(DeskStacks + lVar3);
    pCVar1->m_face = CF_UP;
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void tbl_Init(void)
{
  stk_InitFull(&PackStack);
  stk_InitEmpty(&RestStack);
  stk_InitEmptyArray(DeskStacks, NUM_STACKS);
  stk_InitEmptyArray(ColorStacks, NUM_CARD_COLORS);
  Score = 0;

  // draw cards from the pack into desk
  for (int i = 0; i < NUM_STACKS; i++) {
    for (int j = 0; j <= i; j++) {
      Card_t card;
      stk_Pop(&PackStack, &card);
      stk_PushCopy(&DeskStacks[i], card);
    }
    stk_TopCard(&DeskStacks[i])->m_face = CF_UP;
  }
}